

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

QStyleOptionTitleBar * __thiscall
QMdiSubWindowPrivate::titleBarOptions
          (QStyleOptionTitleBar *__return_storage_ptr__,QMdiSubWindowPrivate *this)

{
  State *pSVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  QWidget *widget;
  Data *pDVar6;
  qsizetype qVar7;
  char16_t *pcVar8;
  bool bVar9;
  bool bVar10;
  SubControl SVar11;
  WindowStates WVar12;
  ColorGroup CVar13;
  int iVar14;
  QStyle *pQVar15;
  int iVar16;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  widget = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  (__return_storage_ptr__->icon).d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&__return_storage_ptr__->titleBarState = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->text).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->text).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_QStyleOptionComplex).subControls =
       &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->text).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)
   &(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.palette.currentGroup =
       &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.styleObject =
       (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)
   &(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.fontMetrics =
       &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.palette.d =
       (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.rect =
       &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.rect.x2 =
       &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption =
       &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.state =
       &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionTitleBar::QStyleOptionTitleBar(__return_storage_ptr__);
  QStyleOption::initFrom((QStyleOption *)__return_storage_ptr__,widget);
  SVar11 = this->activeSubControl;
  if (SVar11 == SC_None) {
    bVar9 = autoRaise(this);
    if ((bVar9) && (SVar11 = this->hoveredSubControl, (SVar11 & ~SC_TitleBarLabel) != SC_None)) {
      pbVar2 = (byte *)((long)&(__return_storage_ptr__->super_QStyleOptionComplex).
                               super_QStyleOption.state.
                               super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i + 1);
      *pbVar2 = *pbVar2 | 0x20;
    }
    else {
      pbVar2 = (byte *)((long)&(__return_storage_ptr__->super_QStyleOptionComplex).
                               super_QStyleOption.state.
                               super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i + 1);
      *pbVar2 = *pbVar2 & 0xdf;
      SVar11 = SC_None;
    }
  }
  else {
    if (this->hoveredSubControl != SVar11) goto LAB_004182b7;
    pSVar1 = &(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.state;
    *(byte *)&(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
               super_QFlagsStorage<QStyle::StateFlag>.i | 4;
  }
  (__return_storage_ptr__->super_QStyleOptionComplex).activeSubControls.
  super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i =
       SVar11;
LAB_004182b7:
  (__return_storage_ptr__->super_QStyleOptionComplex).subControls.
  super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i =
       0xffffffff;
  (__return_storage_ptr__->titleBarFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
  super_QFlagsStorage<Qt::WindowType>.i =
       (widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i;
  WVar12 = QWidget::windowState(widget);
  __return_storage_ptr__->titleBarState =
       (int)WVar12.super_QFlagsStorageHelper<Qt::WindowState,_4>.
            super_QFlagsStorage<Qt::WindowState>.i;
  QPalette::operator=(&(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.
                       palette,&this->titleBarPalette);
  QIcon::operator=(&__return_storage_ptr__->icon,&this->menuIcon);
  uVar3 = (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.state.
          super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i;
  if (this->isActive == true) {
    (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.state.
    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i =
         uVar3 | 0x10000;
    pbVar2 = (byte *)((long)&__return_storage_ptr__->titleBarState + 2);
    *pbVar2 = *pbVar2 | 1;
    CVar13 = Active;
  }
  else {
    (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.state.
    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i =
         uVar3 & 0xfffeffff;
    CVar13 = Inactive;
  }
  (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.palette.currentGroup =
       CVar13;
  bVar9 = hasBorder(this,__return_storage_ptr__);
  iVar16 = (uint)!bVar9 * 4 + -4;
  iVar14 = titleBarHeight(this,__return_storage_ptr__);
  bVar10 = QWidget::isMinimized(widget);
  iVar4 = (widget->data->crect).x2.m_i;
  iVar5 = (widget->data->crect).x1.m_i;
  (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.rect.x1.m_i =
       (uint)bVar9 * 4;
  (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.rect.y1.m_i =
       (uint)bVar9 * 4;
  (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.rect.x2.m_i =
       (iVar16 + iVar4) - iVar5;
  (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.rect.y2.m_i =
       iVar14 + (uint)bVar9 * 4 + (iVar16 << bVar10) + -1;
  if ((this->windowTitle).d.size != 0) {
    QString::operator=(&__return_storage_ptr__->text,(QString *)&this->windowTitle);
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_58,&this->font);
    pDVar6 = *(Data **)&(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.
                        fontMetrics;
    *(Data **)&(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.fontMetrics =
         local_58.d;
    local_58.d = pDVar6;
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_58);
    pQVar15 = QWidget::style(widget);
    (**(code **)(*(long *)pQVar15 + 0xd8))(pQVar15,5,__return_storage_ptr__,0x100,widget);
    QFontMetrics::elidedText
              ((QString *)&local_58,(int)__return_storage_ptr__ + 0x20,(int)&this->windowTitle,1);
    pDVar6 = (__return_storage_ptr__->text).d.d;
    pcVar8 = (__return_storage_ptr__->text).d.ptr;
    (__return_storage_ptr__->text).d.d = local_58.d;
    (__return_storage_ptr__->text).d.ptr = local_58.ptr;
    qVar7 = (__return_storage_ptr__->text).d.size;
    (__return_storage_ptr__->text).d.size = local_58.size;
    local_58.d = pDVar6;
    local_58.ptr = pcVar8;
    local_58.size = qVar7;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStyleOptionTitleBar QMdiSubWindowPrivate::titleBarOptions() const
{
    Q_Q(const QMdiSubWindow);
    QStyleOptionTitleBar titleBarOptions;
    titleBarOptions.initFrom(q);
    if (activeSubControl != QStyle::SC_None) {
        if (hoveredSubControl == activeSubControl) {
            titleBarOptions.state |= QStyle::State_Sunken;
            titleBarOptions.activeSubControls = activeSubControl;
        }
    } else if (autoRaise() && hoveredSubControl != QStyle::SC_None
               && hoveredSubControl != QStyle::SC_TitleBarLabel) {
        titleBarOptions.state |= QStyle::State_MouseOver;
        titleBarOptions.activeSubControls = hoveredSubControl;
    } else {
        titleBarOptions.state &= ~QStyle::State_MouseOver;
        titleBarOptions.activeSubControls = QStyle::SC_None;
    }

    titleBarOptions.subControls = QStyle::SC_All;
    titleBarOptions.titleBarFlags = q->windowFlags();
    titleBarOptions.titleBarState = q->windowState();
    titleBarOptions.palette = titleBarPalette;
    titleBarOptions.icon = menuIcon;

    if (isActive) {
        titleBarOptions.state |= QStyle::State_Active;
        titleBarOptions.titleBarState |= QStyle::State_Active;
        titleBarOptions.palette.setCurrentColorGroup(QPalette::Active);
    } else {
        titleBarOptions.state &= ~QStyle::State_Active;
        titleBarOptions.palette.setCurrentColorGroup(QPalette::Inactive);
    }

    int border = hasBorder(titleBarOptions) ? 4 : 0;
    int paintHeight = titleBarHeight(titleBarOptions);
    paintHeight -= q->isMinimized() ? 2 * border : border;
    titleBarOptions.rect = QRect(border, border, q->width() - 2 * border, paintHeight);

    if (!windowTitle.isEmpty()) {
        // Set the text here before asking for the width of the title bar label
        // in case people uses the actual text to calculate the width.
        titleBarOptions.text = windowTitle;
        titleBarOptions.fontMetrics = QFontMetrics(font);
        int width = q->style()->subControlRect(QStyle::CC_TitleBar, &titleBarOptions,
                                               QStyle::SC_TitleBarLabel, q).width();
        // Set elided text if we don't have enough space for the entire title.
        titleBarOptions.text = titleBarOptions.fontMetrics.elidedText(windowTitle, Qt::ElideRight, width);
    }
    return titleBarOptions;
}